

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output.c
# Opt level: O2

int outshow(void)

{
  outflag = 1;
  if ((dbghid != 0) && ((hidout & 1) != 0)) {
    hidout = 0;
    trcsho();
  }
  return (uint)outcnt;
}

Assistant:

int outshow(void)
{
    /* turn output back on */
    outflag = 1;

    /* if we're debugging, note the end of hidden output */
    if (dbghid && hidout)
    {
        hidout = 0;
        trcsho();
    }

    /* return the flag indicating whether hidden output occurred */
    return outcnt;
}